

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  XMLBuffer *this_00;
  XMLSize_t XVar1;
  XMLSize_t XVar2;
  XMLCh *pXVar3;
  XMLAttr *this_01;
  XMLSize_t XVar4;
  
  this_00 = &this->fAnnotationBuf;
  if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar4 = (this->fAnnotationBuf).fIndex;
  (this->fAnnotationBuf).fIndex = XVar4 + 1;
  (this->fAnnotationBuf).fBuffer[XVar4] = L'<';
  pXVar3 = QName::getRawName(elemDecl->fElementName);
  XMLBuffer::append(this_00,pXVar3);
  if (attrCount != 0) {
    XVar4 = 0;
    do {
      this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar4);
      if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar1 = (this->fAnnotationBuf).fIndex;
      (this->fAnnotationBuf).fIndex = XVar1 + 1;
      (this->fAnnotationBuf).fBuffer[XVar1] = L' ';
      pXVar3 = XMLAttr::getQName(this_01);
      XMLBuffer::append(this_00,pXVar3);
      if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar2 = (this->fAnnotationBuf).fIndex;
      XVar1 = XVar2 + 1;
      (this->fAnnotationBuf).fIndex = XVar1;
      (this->fAnnotationBuf).fBuffer[XVar2] = L'=';
      if (XVar1 == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar1 = (this->fAnnotationBuf).fIndex;
      (this->fAnnotationBuf).fIndex = XVar1 + 1;
      (this->fAnnotationBuf).fBuffer[XVar1] = L'\"';
      XMLBuffer::append(this_00,this_01->fValue);
      if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar1 = (this->fAnnotationBuf).fIndex;
      (this->fAnnotationBuf).fIndex = XVar1 + 1;
      (this->fAnnotationBuf).fBuffer[XVar1] = L'\"';
      XVar4 = XVar4 + 1;
    } while (attrCount != XVar4);
  }
  if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar4 = (this->fAnnotationBuf).fIndex;
  (this->fAnnotationBuf).fIndex = XVar4 + 1;
  (this->fAnnotationBuf).fBuffer[XVar4] = L'>';
  return;
}

Assistant:

void XSDDOMParser::startAnnotationElement( const XMLElementDecl&       elemDecl
                                         , const RefVectorOf<XMLAttr>& attrList
                                         , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
    fAnnotationBuf.append(elemDecl.getFullName());
    //fAnnotationBuf.append(chSpace);

    for(XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttr = attrList.elementAt(i);
        fAnnotationBuf.append(chSpace);
        fAnnotationBuf.append(oneAttr ->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(oneAttr->getValue());
        fAnnotationBuf.append(chDoubleQuote);
    }

    fAnnotationBuf.append(chCloseAngle);
}